

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageChannel.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TypedFlatImageChannel<Imath_3_2::half>::resize
          (TypedFlatImageChannel<Imath_3_2::half> *this)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  ulong uVar3;
  _func_int **pp_Var4;
  half *phVar5;
  ImageChannel *in_RDI;
  size_t i;
  float in_stack_ffffffffffffffcc;
  half *this_00;
  undefined2 local_12;
  half *local_10;
  
  if (in_RDI[1]._vptr_ImageChannel != (_func_int **)0x0) {
    operator_delete__(in_RDI[1]._vptr_ImageChannel);
  }
  in_RDI[1]._vptr_ImageChannel = (_func_int **)0x0;
  FlatImageChannel::resize((FlatImageChannel *)0x12c36e);
  sVar2 = ImageChannel::numPixels(in_RDI);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(2),0);
  if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pp_Var4 = (_func_int **)operator_new__(uVar3);
  in_RDI[1]._vptr_ImageChannel = pp_Var4;
  local_10 = (half *)0x0;
  while( true ) {
    this_00 = local_10;
    phVar5 = (half *)ImageChannel::numPixels(in_RDI);
    if (phVar5 <= this_00) break;
    Imath_3_2::half::half(this_00,in_stack_ffffffffffffffcc);
    *(undefined2 *)((long)in_RDI[1]._vptr_ImageChannel + (long)local_10 * 2) = local_12;
    local_10 = (half *)((long)&local_10->_h + 1);
  }
  (*in_RDI->_vptr_ImageChannel[5])();
  return;
}

Assistant:

void
TypedFlatImageChannel<T>::resize ()
{
    delete[] _pixels;
    _pixels = 0;

    FlatImageChannel::resize (); // may throw an exception

    _pixels = new T[numPixels ()];

    for (size_t i = 0; i < numPixels (); ++i)
        _pixels[i] = T (0);

    resetBasePointer ();
}